

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O2

bool __thiscall banksia::ChessBoard::fromSanMoveList(ChessBoard *this,string *str)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  string *str_00;
  Move MVar3;
  char local_51;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  string ss;
  
  std::__cxx11::string::string((string *)&ss,(string *)str);
  vec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x2e;
  local_51 = ' ';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ss._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(ss._M_dataplus._M_p + ss._M_string_length),(char *)&vec,&local_51);
  splitString(&vec,&ss,' ');
  for (str_00 = (string *)
                CONCAT71(vec.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         vec.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_);
      str_00 != vec.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; str_00 = str_00 + 1) {
    if (1 < str_00->_M_string_length) {
      pcVar2 = (char *)std::__cxx11::string::at((ulong)str_00);
      if (9 < (int)*pcVar2 - 0x30U) {
        MVar3 = fromSanString(this,str_00);
        bVar1 = checkMake(this,MVar3.from,MVar3.dest,MVar3.promotion);
        if (!bVar1) break;
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vec);
  std::__cxx11::string::~string((string *)&ss);
  return str_00 == vec.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool ChessBoard::fromSanMoveList(const std::string& str)
{
    // Some opening such as Gaviota one has no space between counter and move, e.g.
    // 1.d4 d5 2.c4 dxc4 3.Nf3 a6 4.e3 Nf6 5.Bxc4 b5 6.Bd3 Bb7 7.O-O Nbd7 8.b4 *
    auto ss = str;
    std::replace(ss.begin(), ss.end(), '.', ' ');
    auto vec = splitString(ss, ' ');
    
    for(auto && s : vec) {
        if (s.length() < 2 || isdigit(s.at(0))) {
            continue;
        }
        
        auto move = fromSanString(s);
        if (!checkMake(move.from, move.dest, move.promotion)) {
            return false;
        }
    }
    return true;
}